

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O0

void __thiscall TApp_MultipleSubcomMatching_Test::TestBody(TApp_MultipleSubcomMatching_Test *this)

{
  bool bVar1;
  AssertHelper local_188;
  Message local_180 [2];
  OptionAlreadyAdded *anon_var_0;
  string local_168;
  allocator local_141;
  string local_140;
  byte local_119;
  char *pcStack_118;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  string local_108;
  allocator local_e1;
  string local_e0;
  allocator local_b9;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  TApp_MultipleSubcomMatching_Test *local_10;
  TApp_MultipleSubcomMatching_Test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"first",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"",&local_69);
  CLI::App::add_subcommand(&(this->super_TApp).app,&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"second",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"",&local_b9);
  CLI::App::add_subcommand(&(this->super_TApp).app,&local_90,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"Second",&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"",(allocator *)((long)&gtest_msg.value + 7));
  CLI::App::add_subcommand(&(this->super_TApp).app,&local_e0,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffee8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffee8);
  if (bVar1) {
    local_119 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_140,"first",&local_141);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_168,"",(allocator *)((long)&anon_var_0 + 7));
      CLI::App::add_subcommand(&(this->super_TApp).app,&local_140,&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator((allocator<char> *)&local_141);
    }
    if ((local_119 & 1) != 0) {
      return;
    }
    pcStack_118 = 
    "Expected: app.add_subcommand(\"first\") throws an exception of type CLI::OptionAlreadyAdded.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_180);
  testing::internal::AssertHelper::AssertHelper
            (&local_188,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
             ,0x45,pcStack_118);
  testing::internal::AssertHelper::operator=(&local_188,local_180);
  testing::internal::AssertHelper::~AssertHelper(&local_188);
  testing::Message::~Message(local_180);
  return;
}

Assistant:

TEST_F(TApp, MultipleSubcomMatching) {
    app.add_subcommand("first");
    app.add_subcommand("second");
    app.add_subcommand("Second");
    EXPECT_THROW(app.add_subcommand("first"), CLI::OptionAlreadyAdded);
}